

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drawImage.cpp
# Opt level: O3

void anon_unknown.dwarf_109f::sp
               (Array2D<Imf_3_4::Rgba> *px,int w,int h,float xc,float yc,float rc,float rd,float gn,
               float bl,float lm)

{
  Rgba *pRVar1;
  char cVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  ushort uVar7;
  long lVar8;
  uint uVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  
  fVar10 = floorf(yc - rc);
  fVar18 = 0.0;
  if (0.0 <= fVar10) {
    fVar18 = fVar10;
  }
  fVar11 = ceilf(yc + rc);
  fVar10 = (float)h + -1.0;
  if (fVar11 <= (float)h + -1.0) {
    fVar10 = fVar11;
  }
  if ((int)fVar18 <= (int)fVar10) {
    fVar12 = ceilf(xc + rc);
    fVar11 = (float)w + -1.0;
    if (fVar12 <= (float)w + -1.0) {
      fVar11 = fVar12;
    }
    fVar13 = floorf(xc - rc);
    fVar12 = 0.0;
    if (0.0 <= fVar13) {
      fVar12 = fVar13;
    }
    lVar8 = (long)(int)fVar18;
    do {
      if ((int)fVar12 <= (int)fVar11) {
        fVar18 = ((float)(int)lVar8 - yc) / rc;
        lVar6 = (long)(int)fVar12;
        do {
          fVar16 = ((float)(int)lVar6 - xc) / rc;
          fVar13 = SQRT(fVar16 * fVar16 + fVar18 * fVar18);
          if (fVar13 < 1.0) {
            fVar14 = 1.0 - fVar13 * fVar13;
            if (fVar14 < 0.0) {
              fVar14 = sqrtf(fVar14);
            }
            else {
              fVar14 = SQRT(fVar14);
            }
            lVar3 = _imath_half_to_float_table;
            fVar16 = fVar14 * 0.7071 + fVar16 * 0.42426 + fVar18 * -0.56568;
            fVar15 = (float)(-(uint)(fVar16 < 0.0) & (uint)(fVar16 * -0.1) |
                            ~-(uint)(fVar16 < 0.0) & (uint)fVar16);
            uVar4 = 0x32;
            fVar14 = 1.0;
            fVar16 = fVar15;
            do {
              if ((uVar4 & 1) != 0) {
                fVar14 = fVar14 * fVar16;
              }
              fVar16 = fVar16 * fVar16;
              uVar9 = (uint)uVar4;
              uVar4 = uVar4 >> 1;
            } while (1 < uVar9);
            uVar9 = -(uint)(rc + -1.0 < fVar13 * rc);
            fVar13 = (float)(~uVar9 & 0x3f800000 | (uint)(rc - fVar13 * rc) & uVar9);
            fVar15 = fVar15 + fVar14 * 4.0;
            lVar5 = px->_sizeY * lVar8;
            pRVar1 = px->_data;
            fVar14 = 1.0 - fVar13;
            fVar17 = *(float *)(_imath_half_to_float_table + (ulong)pRVar1[lVar5 + lVar6].r._h * 4)
                     * fVar14 + fVar15 * rd * lm * fVar13;
            fVar16 = ABS(fVar17);
            uVar7 = (ushort)((uint)fVar17 >> 0x10) & 0x8000;
            if ((uint)fVar16 < 0x38800000) {
              if ((0x33000000 < (uint)fVar16) &&
                 (uVar9 = (uint)fVar16 & 0x7fffff | 0x800000, cVar2 = (char)((uint)fVar16 >> 0x17),
                 uVar7 = uVar7 | (ushort)(uVar9 >> (0x7eU - cVar2 & 0x1f)),
                 0x80000000 < uVar9 << (cVar2 + 0xa2U & 0x1f))) {
                uVar7 = uVar7 + 1;
              }
            }
            else if ((uint)fVar16 < 0x7f800000) {
              if ((uint)fVar16 < 0x477ff000) {
                uVar7 = (ushort)((int)fVar16 + 0x8000fff + (uint)(((uint)fVar16 >> 0xd & 1) != 0) >>
                                0xd) | uVar7;
              }
              else {
                uVar7 = uVar7 | 0x7c00;
              }
            }
            else {
              uVar7 = uVar7 | 0x7c00;
              if (fVar16 != INFINITY) {
                uVar9 = (uint)fVar16 >> 0xd & 0x3ff;
                uVar7 = uVar7 | (ushort)uVar9 | (ushort)(uVar9 == 0);
              }
            }
            pRVar1[lVar5 + lVar6].r._h = uVar7;
            fVar17 = *(float *)(lVar3 + (ulong)pRVar1[lVar5 + lVar6].g._h * 4) * fVar14 +
                     fVar15 * gn * lm * fVar13;
            fVar16 = ABS(fVar17);
            uVar7 = (ushort)((uint)fVar17 >> 0x10) & 0x8000;
            if ((uint)fVar16 < 0x38800000) {
              if ((0x33000000 < (uint)fVar16) &&
                 (uVar9 = (uint)fVar16 & 0x7fffff | 0x800000, cVar2 = (char)((uint)fVar16 >> 0x17),
                 uVar7 = uVar7 | (ushort)(uVar9 >> (0x7eU - cVar2 & 0x1f)),
                 0x80000000 < uVar9 << (cVar2 + 0xa2U & 0x1f))) {
                uVar7 = uVar7 + 1;
              }
            }
            else if ((uint)fVar16 < 0x7f800000) {
              if ((uint)fVar16 < 0x477ff000) {
                uVar7 = (ushort)((int)fVar16 + 0x8000fff + (uint)(((uint)fVar16 >> 0xd & 1) != 0) >>
                                0xd) | uVar7;
              }
              else {
                uVar7 = uVar7 | 0x7c00;
              }
            }
            else {
              uVar7 = uVar7 | 0x7c00;
              if (fVar16 != INFINITY) {
                uVar9 = (uint)fVar16 >> 0xd & 0x3ff;
                uVar7 = uVar7 | (ushort)uVar9 | (ushort)(uVar9 == 0);
              }
            }
            pRVar1[lVar5 + lVar6].g._h = uVar7;
            fVar16 = *(float *)(lVar3 + (ulong)pRVar1[lVar5 + lVar6].b._h * 4) * fVar14 +
                     fVar13 * fVar15 * bl * lm;
            fVar13 = ABS(fVar16);
            uVar7 = (ushort)((uint)fVar16 >> 0x10) & 0x8000;
            if ((uint)fVar13 < 0x38800000) {
              if ((0x33000000 < (uint)fVar13) &&
                 (uVar9 = (uint)fVar13 & 0x7fffff | 0x800000, cVar2 = (char)((uint)fVar13 >> 0x17),
                 uVar7 = uVar7 | (ushort)(uVar9 >> (0x7eU - cVar2 & 0x1f)),
                 0x80000000 < uVar9 << (cVar2 + 0xa2U & 0x1f))) {
                uVar7 = uVar7 + 1;
              }
            }
            else if ((uint)fVar13 < 0x7f800000) {
              if ((uint)fVar13 < 0x477ff000) {
                uVar7 = (ushort)((int)fVar13 + 0x8000fff + (uint)(((uint)fVar13 >> 0xd & 1) != 0) >>
                                0xd) | uVar7;
              }
              else {
                uVar7 = uVar7 | 0x7c00;
              }
            }
            else {
              uVar7 = uVar7 | 0x7c00;
              if (fVar13 != INFINITY) {
                uVar9 = (uint)fVar13 >> 0xd & 0x3ff;
                uVar7 = uVar7 | (ushort)uVar9 | (ushort)(uVar9 == 0);
              }
            }
            pRVar1[lVar5 + lVar6].b._h = uVar7;
            fVar16 = 1.0 - (1.0 - *(float *)(lVar3 + (ulong)pRVar1[lVar5 + lVar6].a._h * 4)) *
                           fVar14;
            fVar13 = ABS(fVar16);
            uVar7 = (ushort)((uint)fVar16 >> 0x10) & 0x8000;
            if ((uint)fVar13 < 0x38800000) {
              if ((0x33000000 < (uint)fVar13) &&
                 (uVar9 = (uint)fVar13 & 0x7fffff | 0x800000, cVar2 = (char)((uint)fVar13 >> 0x17),
                 uVar7 = uVar7 | (ushort)(uVar9 >> (0x7eU - cVar2 & 0x1f)),
                 0x80000000 < uVar9 << (cVar2 + 0xa2U & 0x1f))) {
                uVar7 = uVar7 + 1;
              }
            }
            else if ((uint)fVar13 < 0x7f800000) {
              if ((uint)fVar13 < 0x477ff000) {
                uVar7 = (ushort)((int)fVar13 + 0x8000fff + (uint)(((uint)fVar13 >> 0xd & 1) != 0) >>
                                0xd) | uVar7;
              }
              else {
                uVar7 = uVar7 | 0x7c00;
              }
            }
            else {
              uVar7 = uVar7 | 0x7c00;
              if (fVar13 != INFINITY) {
                uVar9 = (uint)fVar13 >> 0xd & 0x3ff;
                uVar7 = uVar7 | (ushort)uVar9 | (ushort)(uVar9 == 0);
              }
            }
            pRVar1[lVar5 + lVar6].a._h = uVar7;
          }
          lVar6 = lVar6 + 1;
        } while ((int)fVar11 + 1 != (int)lVar6);
      }
      lVar8 = lVar8 + 1;
    } while ((int)fVar10 + 1 != (int)lVar8);
  }
  return;
}

Assistant:

void
sp (Array2D<Rgba>& px,
    int            w,
    int            h,
    float          xc,
    float          yc,
    float          rc,
    float          rd,
    float          gn,
    float          bl,
    float          lm)
{
    int x1 = int (max ((float) floor (xc - rc), 0.0f));
    int x2 = int (min ((float) ceil (xc + rc), w - 1.0f));
    int y1 = int (max ((float) floor (yc - rc), 0.0f));
    int y2 = int (min ((float) ceil (yc + rc), h - 1.0f));

    for (int y = y1; y <= y2; ++y)
    {
        for (int x = x1; x <= x2; ++x)
        {
            float xl = (x - xc) / rc;
            float yl = (y - yc) / rc;
            float r  = sqrt (xl * xl + yl * yl);

            if (r >= 1) continue;

            float a = 1;

            if (r * rc > rc - 1) a = rc - r * rc;

            float zl = sqrt (1 - r * r);
            float dl = xl * 0.42426 - yl * 0.56568 + zl * 0.70710;

            if (dl < 0) dl *= -0.1;

            float hl = pw (dl, 50) * 4;
            float dr = (dl + hl) * rd;
            float dg = (dl + hl) * gn;
            float db = (dl + hl) * bl;

            Rgba& p = px[y][x];
            p.r     = p.r * (1 - a) + dr * lm * a;
            p.g     = p.g * (1 - a) + dg * lm * a;
            p.b     = p.b * (1 - a) + db * lm * a;
            p.a     = 1 - (1 - p.a) * (1 - a);
        }
    }
}